

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

CK_RV __thiscall Session::getInfo(Session *this,CK_SESSION_INFO_PTR pInfo)

{
  CK_SLOT_ID CVar1;
  CK_STATE CVar2;
  
  if (pInfo != (CK_SESSION_INFO_PTR)0x0) {
    CVar1 = Slot::getSlotID(this->slot);
    pInfo->slotID = CVar1;
    CVar2 = getState(this);
    pInfo->state = CVar2;
    pInfo->flags = 4;
    pInfo->flags = (ulong)this->isReadWrite * 2 + 4;
    pInfo->ulDeviceError = 0;
    return 0;
  }
  return 7;
}

Assistant:

CK_RV Session::getInfo(CK_SESSION_INFO_PTR pInfo)
{
	if (pInfo == NULL_PTR) return CKR_ARGUMENTS_BAD;

	pInfo->slotID = slot->getSlotID();

	pInfo->state = getState();
	pInfo->flags = CKF_SERIAL_SESSION;
	if (isRW())
	{
		pInfo->flags |= CKF_RW_SESSION;
	}
	pInfo->ulDeviceError = 0;

	return CKR_OK;
}